

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O1

char * Scl_LibertyReadCellLeakage(Scl_Tree_t *p,Scl_Item_t *pCell)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  char *pcVar8;
  Scl_Item_t *pSVar9;
  Scl_Item_t *pSVar10;
  
  uVar1 = pCell->Child;
  iVar2 = p->nItems;
  if (iVar2 <= (int)uVar1) {
LAB_0045d2e5:
    __assert_fail("v < p->nItems",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLiberty.c"
                  ,0x4d,"Scl_Item_t *Scl_LibertyItem(Scl_Tree_t *, int)");
  }
  if ((int)uVar1 < 0) {
    pSVar9 = (Scl_Item_t *)0x0;
  }
  else {
    pSVar9 = p->pItems + uVar1;
  }
  if (pSVar9 != (Scl_Item_t *)0x0) {
    pcVar8 = p->pContents;
    do {
      iVar5 = (pSVar9->Key).Beg;
      iVar4 = (pSVar9->Key).End - iVar5;
      iVar5 = strncmp(pcVar8 + iVar5,"cell_leakage_power",(long)iVar4);
      if (iVar4 == 0x12 && iVar5 == 0) {
LAB_0045d2c9:
        pcVar8 = Scl_LibertyReadString(p,pSVar9->Head);
        return pcVar8;
      }
      uVar3 = pSVar9->Next;
      if (iVar2 <= (int)uVar3) goto LAB_0045d2e5;
      if ((int)uVar3 < 0) {
        pSVar9 = (Scl_Item_t *)0x0;
      }
      else {
        pSVar9 = p->pItems + uVar3;
      }
    } while (pSVar9 != (Scl_Item_t *)0x0);
  }
  if ((int)uVar1 < 0) {
    pSVar10 = (Scl_Item_t *)0x0;
  }
  else {
    pSVar10 = p->pItems + uVar1;
  }
  if (pSVar10 != (Scl_Item_t *)0x0) {
    pcVar8 = p->pContents;
    do {
      iVar5 = (pSVar10->Key).Beg;
      iVar4 = (pSVar10->Key).End - iVar5;
      iVar5 = strncmp(pcVar8 + iVar5,"leakage_power",(long)iVar4);
      if (iVar4 == 0xd && iVar5 == 0) {
        uVar1 = pSVar10->Child;
        uVar7 = (ulong)uVar1;
        if ((int)uVar1 < iVar2) {
          uVar6 = uVar7;
          if ((int)uVar1 < 0) goto LAB_0045d1d7;
          do {
            pSVar9 = p->pItems + uVar6;
            while( true ) {
              if (pSVar9 == (Scl_Item_t *)0x0) {
                if ((int)uVar1 < 0) goto LAB_0045d23a;
                goto LAB_0045d280;
              }
              iVar5 = (pSVar9->Key).Beg;
              iVar4 = (pSVar9->Key).End - iVar5;
              iVar5 = strncmp(pcVar8 + iVar5,"when",(long)iVar4);
              if (iVar4 == 4 && iVar5 == 0) goto LAB_0045d28e;
              uVar3 = pSVar9->Next;
              uVar6 = (ulong)uVar3;
              if (iVar2 <= (int)uVar3) goto LAB_0045d2e5;
              if (-1 < (int)uVar3) break;
LAB_0045d1d7:
              pSVar9 = (Scl_Item_t *)0x0;
            }
          } while( true );
        }
        goto LAB_0045d2e5;
      }
LAB_0045d28e:
      uVar1 = pSVar10->Next;
      if (iVar2 <= (int)uVar1) goto LAB_0045d2e5;
      if ((int)uVar1 < 0) {
        pSVar10 = (Scl_Item_t *)0x0;
      }
      else {
        pSVar10 = p->pItems + uVar1;
      }
    } while (pSVar10 != (Scl_Item_t *)0x0);
  }
  return (char *)0x0;
LAB_0045d280:
  pSVar9 = p->pItems + uVar7;
  while( true ) {
    if (pSVar9 == (Scl_Item_t *)0x0) goto LAB_0045d28e;
    iVar5 = (pSVar9->Key).Beg;
    iVar4 = (pSVar9->Key).End - iVar5;
    iVar5 = strncmp(pcVar8 + iVar5,"value",(long)iVar4);
    if (iVar4 == 5 && iVar5 == 0) goto LAB_0045d2c9;
    uVar1 = pSVar9->Next;
    uVar7 = (ulong)uVar1;
    if (iVar2 <= (int)uVar1) goto LAB_0045d2e5;
    if (-1 < (int)uVar1) break;
LAB_0045d23a:
    pSVar9 = (Scl_Item_t *)0x0;
  }
  goto LAB_0045d280;
}

Assistant:

char * Scl_LibertyReadCellLeakage( Scl_Tree_t * p, Scl_Item_t * pCell )
{
    Scl_Item_t * pItem, * pChild;
    Scl_ItemForEachChildName( p, pCell, pItem, "cell_leakage_power" )
        return Scl_LibertyReadString(p, pItem->Head);
    // look for another type
    Scl_ItemForEachChildName( p, pCell, pItem, "leakage_power" )
    {
        Scl_ItemForEachChildName( p, pItem, pChild, "when" )
            break;
        if ( pChild && !Scl_LibertyCompare(p, pChild->Key, "when") )
            continue;
        Scl_ItemForEachChildName( p, pItem, pChild, "value" )
            return Scl_LibertyReadString(p, pChild->Head);
    }
    return 0;
}